

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase739::run(TestCase739 *this)

{
  CapTableBuilder **this_00;
  Client *this_01;
  undefined8 uVar1;
  RequestHook *pRVar2;
  long *plVar3;
  CapTableBuilder *pCVar4;
  undefined8 uVar5;
  CapTableReader *pCVar6;
  ClientHook *pCVar7;
  long lVar8;
  SegmentBuilder *node;
  WirePointer *pWVar9;
  uint uVar10;
  undefined8 *__n;
  int *__n_00;
  char *pcVar11;
  size_t __n_01;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Own<capnp::ClientHook,_std::nullptr_t> OVar13;
  DebugComparison<int,_unsigned_int> _kjCondition;
  int callerCallCount;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  int calleeCallCount;
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  Client callee;
  WaitScope waitScope;
  Client caller;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  EventLoop loop;
  undefined1 local_3d0 [24];
  WirePointer *local_3b8;
  uint local_3b0;
  Disposer *local_3a8;
  RequestHook *local_3a0;
  long *local_398;
  undefined1 local_38c [8];
  uint uStack_384;
  char *local_380;
  long local_378;
  undefined4 local_370;
  undefined1 local_364 [4];
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_360;
  long *local_328;
  undefined1 local_320 [16];
  undefined1 local_310 [56];
  undefined8 *local_2d8;
  CapTableReader *pCStack_2d0;
  pointer_____offset_0x10___ *local_2c8;
  Client local_2c0;
  EventLoop *local_2b0;
  undefined4 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  undefined1 local_290 [16];
  ClientHook *pCStack_280;
  undefined1 local_278 [56];
  undefined8 *local_240;
  long *local_238;
  long local_230;
  undefined8 uStack_228;
  undefined8 *local_220;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_218;
  undefined *puStack_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined *puStack_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined *puStack_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined *puStack_198;
  undefined8 local_190;
  char *local_188;
  undefined *puStack_180;
  undefined8 local_178;
  char *local_170;
  undefined *puStack_168;
  undefined8 local_160;
  char *local_158;
  undefined *puStack_150;
  undefined8 local_148;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_140;
  Maybe<capnp::MessageSize> local_108;
  Maybe<capnp::MessageSize> local_f0;
  Maybe<capnp::MessageSize> local_d8;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop local_a8;
  
  kj::EventLoop::EventLoop(&local_a8);
  local_2a8 = 0xffffffff;
  local_2a0 = 0;
  uStack_298 = 0;
  local_2b0 = &local_a8;
  kj::EventLoop::enterScope(&local_a8);
  local_364 = (undefined1  [4])0x0;
  local_38c._0_4_ = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)local_3d0,(int *)local_364);
  local_360.super_Builder._builder.segment = (SegmentBuilder *)local_3d0._0_8_;
  local_360.super_Builder._builder.capTable = (CapTableBuilder *)(local_3d0._8_8_ + 0x10);
  if ((ClientHook *)local_3d0._8_8_ == (ClientHook *)0x0) {
    local_360.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_3d0._8_8_ = (ClientHook *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     (&local_2c0,(Own<capnp::Capability::Server,_std::nullptr_t> *)(local_364 + 4));
  pCVar4 = local_360.super_Builder._builder.capTable;
  if ((ClientHook *)local_360.super_Builder._builder.capTable != (ClientHook *)0x0) {
    local_360.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_360.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_360.super_Builder._builder.segment,
      (_func_int *)
      ((long)&pCVar4->super_CapTableReader +
      (long)(pCVar4->super_CapTableReader)._vptr_CapTableReader[-2]),OVar13.ptr);
  }
  uVar1 = local_3d0._8_8_;
  local_2c8 = &capnproto_test::capnp::test::TestTailCallee::Client::typeinfo;
  if ((ClientHook *)local_3d0._8_8_ != (ClientHook *)0x0) {
    local_3d0._8_8_ = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)local_3d0._0_8_)->arena->_vptr_Arena)
              (local_3d0._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
  }
  local_3d0._8_8_ = operator_new(0x28);
  ((Maybe<capnp::ClientHook_&> *)&((ClientHook *)local_3d0._8_8_)->brand)->ptr = (ClientHook *)0x0;
  ((ClientHook *)(local_3d0._8_8_ + 0x10))->_vptr_ClientHook = (_func_int **)0x6f0538;
  *(undefined1 *)
   &((Maybe<capnp::ClientHook_&> *)&((ClientHook *)(local_3d0._8_8_ + 0x10))->brand)->ptr = 0;
  ((ClientHook *)local_3d0._8_8_)->_vptr_ClientHook = (_func_int **)&PTR_dispatchCall_006e0170;
  ((ClientHook *)(local_3d0._8_8_ + 0x20))->_vptr_ClientHook = (_func_int **)local_38c;
  __n = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl>::instance;
  local_3d0._0_8_ =
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl>::instance;
  OVar13 = Capability::Client::makeLocalClient
                     ((Client *)(local_364 + 4),
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_3d0);
  uVar1 = local_3d0._8_8_;
  if ((ClientHook *)local_3d0._8_8_ != (ClientHook *)0x0) {
    local_3d0._8_8_ = (ClientHook *)0x0;
    (***(_func_int ***)local_3d0._0_8_)
              (local_3d0._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]),
               OVar13.ptr);
  }
  local_360.super_Builder._builder.data = schemas::s_870bf40110ce3035 + 0x48;
  (*((local_360.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (local_3d0);
  pCVar4 = local_360.super_Builder._builder.capTable;
  local_290._8_4_ = local_3d0._0_4_;
  local_290._12_4_ = local_3d0._4_4_;
  pCStack_280 = (ClientHook *)local_3d0._8_8_;
  local_290._0_8_ = &capnproto_test::capnp::test::TestTailCaller::Client::typeinfo;
  if ((ClientHook *)local_360.super_Builder._builder.capTable != (ClientHook *)0x0) {
    local_360.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_360.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_360.super_Builder._builder.segment,
      (_func_int *)
      ((long)&pCVar4->super_CapTableReader +
      (long)(pCVar4->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  local_c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest
            (&local_140,(Client *)local_290,&local_c0);
  *(undefined4 *)local_140.super_Builder._builder.data = 0x1c8;
  local_360.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_140.super_Builder._builder.segment._4_4_,
                local_140.super_Builder._builder.segment._0_4_);
  local_360.super_Builder._builder.capTable =
       (CapTableBuilder *)
       CONCAT44(local_140.super_Builder._builder.capTable._4_4_,
                local_140.super_Builder._builder.capTable._0_4_);
  local_360.super_Builder._builder.data = local_140.super_Builder._builder.pointers;
  (**(code **)(**(long **)((long)&local_2c0.hook.disposer + (long)local_2c8[-3]) + 0x20))(local_3d0)
  ;
  PointerBuilder::setCapability
            ((PointerBuilder *)(local_364 + 4),(Own<capnp::ClientHook,_std::nullptr_t> *)local_3d0);
  uVar1 = local_3d0._8_8_;
  pvVar12 = extraout_RDX;
  if ((ClientHook *)local_3d0._8_8_ != (ClientHook *)0x0) {
    local_3d0._8_8_ = (ClientHook *)0x0;
    (***(_func_int ***)local_3d0._0_8_)
              (local_3d0._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
    pvVar12 = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send(&local_218,(int)&local_140,pvVar12,(size_t)__n,in_R8D);
  this_00 = &local_218.super_Builder._builder.capTable;
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)local_3d0,(Pipeline *)this_00);
  local_d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)(local_364 + 4),(Client *)local_3d0,&local_d8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)(local_278 + 0x30),(int)local_364 + 4,__buf,(size_t)__n,in_R8D);
  pRVar2 = local_360.hook.ptr;
  if (local_360.hook.ptr != (RequestHook *)0x0) {
    local_360.hook.ptr = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_360.hook.disposer._4_4_,(uint)local_360.hook.disposer)
    )((undefined8 *)CONCAT44(local_360.hook.disposer._4_4_,(uint)local_360.hook.disposer),
      (long)pRVar2 + *(long *)(*(long *)pRVar2 + -0x10));
  }
  uVar1 = local_3d0._16_8_;
  if ((long *)local_3d0._16_8_ != (long *)0x0) {
    local_3d0._16_8_ = (long *)0x0;
    (***(_func_int ***)local_3d0._8_8_)(local_3d0._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_150 = &DAT_004fd5db;
  local_148 = 0x13000002f7;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             (local_364 + 4),&local_218);
  local_3d0._4_4_ = 0;
  if (0x1f < local_360.super_Builder._builder.dataSize) {
    local_3d0._4_4_ = ((WireValue<uint32_t>_conflict *)local_360.super_Builder._builder.data)->value
    ;
  }
  local_3d0._0_4_ = 0x1c8;
  local_3d0._8_8_ = " == ";
  local_3d0._16_8_ = &DAT_00000005;
  if ((local_3d0._4_4_ != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    uVar10 = 0;
    local_278._0_4_ = 0x1c8;
    if (0x1f < local_360.super_Builder._builder.dataSize) {
      uVar10 = ((WireValue<uint32_t>_conflict *)local_360.super_Builder._builder.data)->value;
    }
    local_310._0_4_ = uVar10;
    in_R8D = 0x4fe01b;
    local_3b8._0_1_ = local_3d0._4_4_ == 0x1c8;
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2f8,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
               ,(char (*) [44])"failed: expected (456) == (response.getI())",
               (DebugComparison<int,_unsigned_int> *)local_3d0,(int *)local_278,(uint *)local_310);
  }
  __n_00 = (int *)0x0;
  if (0x1f < local_360.super_Builder._builder.dataSize) {
    __n_00 = (int *)(ulong)((WireValue<uint32_t>_conflict *)local_360.super_Builder._builder.data)->
                           value;
  }
  local_3d0._4_4_ = SUB84(__n_00,0);
  local_3d0._0_4_ = 0x1c8;
  local_3d0._8_8_ = " == ";
  local_3d0._16_8_ = &DAT_00000005;
  local_3b8 = (WirePointer *)CONCAT71(local_3b8._1_7_,local_3d0._4_4_ == 0x1c8);
  if ((local_3d0._4_4_ != 0x1c8) &&
     (__n_00 = &kj::_::Debug::minSeverity, kj::_::Debug::minSeverity < 3)) {
    uVar10 = 0;
    local_278._0_4_ = 0x1c8;
    if (0x1f < local_360.super_Builder._builder.dataSize) {
      uVar10 = ((WireValue<uint32_t>_conflict *)local_360.super_Builder._builder.data)->value;
    }
    local_310._0_4_ = uVar10;
    pcVar11 = 
    "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()";
    in_R8D = 0x4fe01b;
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2f9,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
               ,(char (*) [44])"failed: expected (456) == (response.getI())",
               (DebugComparison<int,_unsigned_int> *)local_3d0,(int *)local_278,(uint *)local_310);
    __n_00 = (int *)pcVar11;
  }
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)local_310,(Pipeline *)this_00);
  local_f0.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_3d0,(Client *)local_310,&local_f0);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_278,(int)local_3d0,__buf_00,(size_t)__n_00,in_R8D);
  pRVar2 = local_3a0;
  if (local_3a0 != (RequestHook *)0x0) {
    local_3a0 = (RequestHook *)0x0;
    (**local_3a8->_vptr_Disposer)
              (local_3a8,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  if ((long *)local_310._16_8_ != (long *)0x0) {
    local_310._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_310._8_8_)->_vptr_CapTableReader)();
  }
  if (local_360.super_Builder._builder.pointerCount < 2) {
    __n_01 = 0x7fffffff;
    local_360.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    local_378 = 0;
    local_360.super_Builder._builder.segment = (SegmentBuilder *)0x0;
  }
  else {
    local_378 = (long)local_360.super_Builder._builder.pointers + 8;
    __n_01 = (size_t)(uint)local_360.hook.disposer;
  }
  local_370 = (undefined4)__n_01;
  unique0x100013f8 = (long)local_360.super_Builder._builder.segment;
  local_380 = (char *)local_360.super_Builder._builder.capTable;
  PointerReader::getCapability((PointerReader *)local_320);
  local_2d8 = (undefined8 *)CONCAT44(local_320._4_4_,local_320._0_4_);
  this_01 = (Client *)(local_310 + 0x30);
  pCStack_2d0 = (CapTableReader *)local_320._8_8_;
  local_310._48_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_108.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_3d0,this_01,&local_108);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_310,(int)local_3d0,__buf_01,__n_01,in_R8D);
  pRVar2 = local_3a0;
  if (local_3a0 != (RequestHook *)0x0) {
    local_3a0 = (RequestHook *)0x0;
    (**local_3a8->_vptr_Disposer)
              (local_3a8,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar6 = pCStack_2d0;
  if (pCStack_2d0 != (CapTableReader *)0x0) {
    pCStack_2d0 = (CapTableReader *)0x0;
    (**(code **)*local_2d8)
              (local_2d8,
               (_func_int *)
               ((long)&pCVar6->_vptr_CapTableReader + (long)pCVar6->_vptr_CapTableReader[-2]));
  }
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_168 = &DAT_004fd5db;
  local_160 = 0x35000002ff;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3d0,local_278 + 0x30);
  plVar3 = local_398;
  uVar10 = 0;
  if (0x1f < local_3b0) {
    uVar10 = *(uint *)local_3d0._16_8_;
  }
  stack0xfffffffffffffc78 = (ulong)uVar10 << 0x20;
  local_380 = " == ";
  local_378 = 5;
  local_370 = CONCAT31(local_370._1_3_,uVar10 == 0);
  if (local_398 != (long *)0x0) {
    local_398 = (long *)0x0;
    (**local_3a0->_vptr_RequestHook)(local_3a0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (((char)local_370 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_310._48_8_ = local_310._48_8_ & 0xffffffff00000000;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
    ;
    puStack_180 = &DAT_004fd5db;
    local_178 = 0x35000002ff;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3d0,local_278 + 0x30);
    local_320._0_4_ = 0;
    if (0x1f < local_3b0) {
      local_320._0_4_ = *(undefined4 *)local_3d0._16_8_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ff,ERROR,
               "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", _kjCondition, 0, dependentCall0.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
               (DebugComparison<int,_unsigned_int> *)(local_38c + 4),(int *)this_01,
               (uint *)local_320);
    plVar3 = local_398;
    if (local_398 != (long *)0x0) {
      local_398 = (long *)0x0;
      (**local_3a0->_vptr_RequestHook)(local_3a0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_198 = &DAT_004fd5db;
  local_190 = 0x3500000300;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3d0,local_278);
  plVar3 = local_398;
  uStack_384 = 0;
  if (0x1f < local_3b0) {
    uStack_384 = *(uint *)local_3d0._16_8_;
  }
  local_38c._4_4_ = 1;
  local_380 = " == ";
  local_378 = 5;
  local_370 = CONCAT31(local_370._1_3_,uStack_384 == 1);
  if (local_398 != (long *)0x0) {
    local_398 = (long *)0x0;
    (**local_3a0->_vptr_RequestHook)(local_3a0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (((char)local_370 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_310._48_4_ = 1;
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
    ;
    puStack_1b0 = &DAT_004fd5db;
    local_1a8 = 0x3500000300;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3d0,local_278);
    local_320._0_4_ = 0;
    if (0x1f < local_3b0) {
      local_320._0_4_ = *(undefined4 *)local_3d0._16_8_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x300,ERROR,
               "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", _kjCondition, 1, dependentCall1.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
               (DebugComparison<int,_unsigned_int> *)(local_38c + 4),(int *)this_01,
               (uint *)local_320);
    plVar3 = local_398;
    if (local_398 != (long *)0x0) {
      local_398 = (long *)0x0;
      (**local_3a0->_vptr_RequestHook)(local_3a0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_1c8 = &DAT_004fd5db;
  local_1c0 = 0x3500000301;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3d0,local_310);
  plVar3 = local_398;
  uStack_384 = 0;
  if (0x1f < local_3b0) {
    uStack_384 = *(uint *)local_3d0._16_8_;
  }
  local_38c._4_4_ = 2;
  local_380 = " == ";
  local_378 = 5;
  local_370 = CONCAT31(local_370._1_3_,uStack_384 == 2);
  if (local_398 != (long *)0x0) {
    local_398 = (long *)0x0;
    (**local_3a0->_vptr_RequestHook)(local_3a0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (((char)local_370 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_310._48_4_ = 2;
    local_218.hook.ptr = (RequestHook *)0x4fd553;
    puStack_1e0 = &DAT_004fd5db;
    local_1d8 = 0x3500000301;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3d0,local_310);
    local_320._0_4_ = 0;
    if (0x1f < local_3b0) {
      local_320._0_4_ = *(undefined4 *)local_3d0._16_8_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x301,ERROR,
               "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", _kjCondition, 2, dependentCall2.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
               (DebugComparison<int,_unsigned_int> *)(local_38c + 4),(int *)this_01,
               (uint *)local_320);
    plVar3 = local_398;
    if (local_398 != (long *)0x0) {
      local_398 = (long *)0x0;
      (**local_3a0->_vptr_RequestHook)(local_3a0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  local_3d0._0_4_ = 1;
  local_3d0._8_8_ = local_364;
  local_3d0._16_8_ = " == ";
  local_3b8 = (WirePointer *)&DAT_00000005;
  if ((local_364 != (undefined1  [4])0x1) && (kj::_::Debug::minSeverity < 3)) {
    local_38c._4_4_ = 1;
    local_3b0._0_1_ = local_364 == (undefined1  [4])0x1;
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x303,ERROR,
               "\"failed: expected \" \"(1) == (calleeCallCount)\", _kjCondition, 1, calleeCallCount"
               ,(char (*) [42])"failed: expected (1) == (calleeCallCount)",
               (DebugComparison<int,_int_&> *)local_3d0,(int *)(local_38c + 4),
               (int *)local_3d0._8_8_);
  }
  local_3d0._0_4_ = 1;
  local_3d0._16_8_ = " == ";
  local_3b8 = (WirePointer *)&DAT_00000005;
  local_3b0 = CONCAT31(local_3b0._1_3_,local_38c._0_4_ == 1);
  local_3d0._8_8_ = (ClientHook *)local_38c;
  if ((local_38c._0_4_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_38c._4_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x304,ERROR,
               "\"failed: expected \" \"(1) == (callerCallCount)\", _kjCondition, 1, callerCallCount"
               ,(char (*) [42])"failed: expected (1) == (callerCallCount)",
               (DebugComparison<int,_int_&> *)local_3d0,(int *)(local_38c + 4),(int *)local_38c);
  }
  uVar5 = local_310._32_8_;
  uVar1 = local_310._24_8_;
  if ((WirePointer *)local_310._24_8_ != (WirePointer *)0x0) {
    local_310._24_8_ = (WirePointer *)0x0;
    local_310._32_4_ = 0;
    local_310._36_2_ = 0;
    local_310._38_2_ = 0;
    (***(_func_int ***)local_310._40_8_)(local_310._40_8_,uVar1,8,uVar5,uVar5,0);
  }
  uVar1 = local_310._16_8_;
  if ((long *)local_310._16_8_ != (long *)0x0) {
    local_310._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_310._8_8_)->_vptr_CapTableReader)
              (local_310._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  uVar1 = local_310._0_8_;
  if ((SegmentBuilder *)local_310._0_8_ != (SegmentBuilder *)0x0) {
    local_310._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  uVar5 = local_278._32_8_;
  uVar1 = local_278._24_8_;
  if ((WirePointer *)local_278._24_8_ != (WirePointer *)0x0) {
    local_278._24_8_ = (WirePointer *)0x0;
    local_278._32_4_ = 0;
    local_278._36_2_ = 0;
    local_278._38_2_ = 0;
    (***(_func_int ***)local_278._40_8_)(local_278._40_8_,uVar1,8,uVar5,uVar5,0);
  }
  uVar1 = local_278._16_8_;
  if ((long *)local_278._16_8_ != (long *)0x0) {
    local_278._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_278._8_8_)->_vptr_CapTableReader)
              (local_278._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  uVar1 = local_278._0_8_;
  if ((SegmentBuilder *)local_278._0_8_ != (SegmentBuilder *)0x0) {
    local_278._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  plVar3 = local_328;
  if (local_328 != (long *)0x0) {
    local_328 = (long *)0x0;
    (*(code *)*(local_360.hook.ptr)->_vptr_RequestHook)
              (local_360.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  uVar1 = uStack_228;
  lVar8 = local_230;
  if (local_230 != 0) {
    local_230 = 0;
    uStack_228 = 0;
    (**(code **)*local_220)(local_220,lVar8,8,uVar1,uVar1,0);
  }
  plVar3 = local_238;
  if (local_238 != (long *)0x0) {
    local_238 = (long *)0x0;
    (**(code **)*local_240)(local_240,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  uVar1 = local_278._48_8_;
  if ((PromiseArenaMember *)local_278._48_8_ != (PromiseArenaMember *)0x0) {
    local_278._48_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  uVar1 = local_218.super_Builder._builder._32_8_;
  pWVar9 = local_218.super_Builder._builder.pointers;
  if (local_218.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_218.super_Builder._builder.pointers = (WirePointer *)0x0;
    local_218.super_Builder._builder.dataSize = 0;
    local_218.super_Builder._builder.pointerCount = 0;
    local_218.super_Builder._builder._38_2_ = 0;
    (**(local_218.hook.disposer)->_vptr_Disposer)(local_218.hook.disposer,pWVar9,8,uVar1,uVar1,0);
  }
  pvVar12 = local_218.super_Builder._builder.data;
  if ((long *)local_218.super_Builder._builder.data != (long *)0x0) {
    local_218.super_Builder._builder.data = (long *)0x0;
    (**((local_218.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_218.super_Builder._builder.capTable,(long)pvVar12 + *(long *)(*pvVar12 + -0x10)
              );
  }
  node = local_218.super_Builder._builder.segment;
  if (local_218.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_218.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  pRVar2 = local_140.hook.ptr;
  if (local_140.hook.ptr != (RequestHook *)0x0) {
    local_140.hook.ptr = (RequestHook *)0x0;
    (**(local_140.hook.disposer)->_vptr_Disposer)
              (local_140.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar7 = pCStack_280;
  if (pCStack_280 != (ClientHook *)0x0) {
    pCStack_280 = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_290._12_4_,local_290._8_4_))
              ((undefined8 *)CONCAT44(local_290._12_4_,local_290._8_4_),
               (_func_int *)((long)&pCVar7->_vptr_ClientHook + (long)pCVar7->_vptr_ClientHook[-2]));
  }
  pCVar7 = local_2c0.hook.ptr;
  if (local_2c0.hook.ptr != (ClientHook *)0x0) {
    local_2c0.hook.ptr = (ClientHook *)0x0;
    (**(local_2c0.hook.disposer)->_vptr_Disposer)
              (local_2c0.hook.disposer,
               (_func_int *)((long)&pCVar7->_vptr_ClientHook + (long)pCVar7->_vptr_ClientHook[-2]));
  }
  if (local_2a0 == 0) {
    kj::EventLoop::leaveScope(local_2b0);
  }
  kj::EventLoop::~EventLoop(&local_a8);
  return;
}

Assistant:

TEST(Capability, DynamicServerTailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller =
      DynamicCapability::Client(kj::heap<TestTailCallerDynamicImpl>(callerCallCount))
          .castAs<test::TestTailCaller>();

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}